

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

RowSetEntry * rowSetNDeepTree(RowSetEntry **ppList,int iDepth)

{
  RowSetEntry *pRVar1;
  RowSetEntry *pLeft;
  RowSetEntry *p;
  int iDepth_local;
  RowSetEntry **ppList_local;
  
  if (*ppList == (RowSetEntry *)0x0) {
    ppList_local = (RowSetEntry **)0x0;
  }
  else {
    if (iDepth < 2) {
      pLeft = *ppList;
      *ppList = pLeft->pRight;
      pLeft->pRight = (RowSetEntry *)0x0;
      pLeft->pLeft = (RowSetEntry *)0x0;
    }
    else {
      pRVar1 = rowSetNDeepTree(ppList,iDepth + -1);
      pLeft = *ppList;
      if (pLeft == (RowSetEntry *)0x0) {
        return pRVar1;
      }
      pLeft->pLeft = pRVar1;
      *ppList = pLeft->pRight;
      pRVar1 = rowSetNDeepTree(ppList,iDepth + -1);
      pLeft->pRight = pRVar1;
    }
    ppList_local = (RowSetEntry **)pLeft;
  }
  return (RowSetEntry *)ppList_local;
}

Assistant:

static struct RowSetEntry *rowSetNDeepTree(
  struct RowSetEntry **ppList,
  int iDepth
){
  struct RowSetEntry *p;         /* Root of the new tree */
  struct RowSetEntry *pLeft;     /* Left subtree */
  if( *ppList==0 ){ /*OPTIMIZATION-IF-TRUE*/
    /* Prevent unnecessary deep recursion when we run out of entries */
    return 0;
  }
  if( iDepth>1 ){   /*OPTIMIZATION-IF-TRUE*/
    /* This branch causes a *balanced* tree to be generated.  A valid tree
    ** is still generated without this branch, but the tree is wildly
    ** unbalanced and inefficient. */
    pLeft = rowSetNDeepTree(ppList, iDepth-1);
    p = *ppList;
    if( p==0 ){     /*OPTIMIZATION-IF-FALSE*/
      /* It is safe to always return here, but the resulting tree
      ** would be unbalanced */
      return pLeft;
    }
    p->pLeft = pLeft;
    *ppList = p->pRight;
    p->pRight = rowSetNDeepTree(ppList, iDepth-1);
  }else{
    p = *ppList;
    *ppList = p->pRight;
    p->pLeft = p->pRight = 0;
  }
  return p;
}